

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool item_tester_uncursable(object *obj)

{
  curse_data *pcVar1;
  curse_data *pcVar2;
  size_t i;
  ulong uVar3;
  bool bVar4;
  
  pcVar2 = obj->known->curses;
  if (pcVar2 == (curse_data *)0x0) {
    return false;
  }
  uVar3 = 1;
  do {
    bVar4 = uVar3 < z_info->curse_max;
    if (!bVar4) {
      return bVar4;
    }
    pcVar1 = pcVar2 + uVar3;
    uVar3 = uVar3 + 1;
  } while (0x62 < (uint)(pcVar1->power + L'\xffffffff'));
  return bVar4;
}

Assistant:

static bool item_tester_uncursable(const struct object *obj)
{
	struct curse_data *c = obj->known->curses;
	if (c) {
		size_t i;
		for (i = 1; i < z_info->curse_max; i++) {
			if (c[i].power > 0 && c[i].power < 100) {
				return true;
			}
		}
	}
	return false;
}